

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_FeatureTypes_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64FeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::Int64FeatureType> *)
           _Int64FeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DoubleFeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::DoubleFeatureType> *)
           _DoubleFeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StringFeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::StringFeatureType> *)
           _StringFeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SizeRange>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SizeRange> *)_SizeRange_default_instance_
            );
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ImageFeatureType_ImageSize>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ImageFeatureType_ImageSize> *)
             _ImageFeatureType_ImageSize_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes> *)
             _ImageFeatureType_EnumeratedImageSizes_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ImageFeatureType_ImageSizeRange>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ImageFeatureType_ImageSizeRange> *)
             _ImageFeatureType_ImageSizeRange_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ImageFeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ImageFeatureType> *)
           _ImageFeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType_Shape>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType_Shape> *)
           _ArrayFeatureType_Shape_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType_EnumeratedShapes> *)
             _ArrayFeatureType_EnumeratedShapes_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType_ShapeRange>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType_ShapeRange> *)
             _ArrayFeatureType_ShapeRange_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ArrayFeatureType> *)
           _ArrayFeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DictionaryFeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::DictionaryFeatureType> *)
           _DictionaryFeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SequenceFeatureType>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SequenceFeatureType> *)
           _SequenceFeatureType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FeatureType>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::FeatureType> *)
             _FeatureType_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64FeatureType_default_instance_.Shutdown();
  _DoubleFeatureType_default_instance_.Shutdown();
  _StringFeatureType_default_instance_.Shutdown();
  _SizeRange_default_instance_.Shutdown();
  _ImageFeatureType_ImageSize_default_instance_.Shutdown();
  _ImageFeatureType_EnumeratedImageSizes_default_instance_.Shutdown();
  _ImageFeatureType_ImageSizeRange_default_instance_.Shutdown();
  _ImageFeatureType_default_instance_.Shutdown();
  _ArrayFeatureType_Shape_default_instance_.Shutdown();
  _ArrayFeatureType_EnumeratedShapes_default_instance_.Shutdown();
  _ArrayFeatureType_ShapeRange_default_instance_.Shutdown();
  _ArrayFeatureType_default_instance_.Shutdown();
  _DictionaryFeatureType_default_instance_.Shutdown();
  _SequenceFeatureType_default_instance_.Shutdown();
  _FeatureType_default_instance_.Shutdown();
}